

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O3

result<sockpp::acceptor> *
sockpp::acceptor::create(result<sockpp::acceptor> *__return_storage_ptr__,int domain)

{
  error_category *peVar1;
  result<int> res;
  result<int> local_50;
  undefined **local_38;
  undefined4 local_30;
  socket local_28;
  
  socket::create_handle(&local_50,domain,1,0);
  if (local_50.err_._M_value == 0) {
    (__return_storage_ptr__->val_).super_socket.handle_ = local_50.val_;
    local_30 = 0xffffffff;
    (__return_storage_ptr__->val_).super_socket._vptr_socket = (_func_int **)&PTR__socket_0010ba00;
    (__return_storage_ptr__->err_)._M_value = 0;
    peVar1 = (error_category *)std::_V2::system_category();
    (__return_storage_ptr__->err_)._M_cat = peVar1;
    local_38 = &PTR__socket_0010bba0;
    socket::close(&local_28,(int)&local_38);
  }
  else {
    (__return_storage_ptr__->val_).super_socket.handle_ = -1;
    (__return_storage_ptr__->val_).super_socket._vptr_socket = (_func_int **)&PTR__socket_0010ba00;
    *(ulong *)&__return_storage_ptr__->err_ = CONCAT44(local_50.err_._4_4_,local_50.err_._M_value);
    (__return_storage_ptr__->err_)._M_cat = local_50.err_._M_cat;
  }
  return __return_storage_ptr__;
}

Assistant:

result<acceptor> acceptor::create(int domain) noexcept {
    if (auto res = create_handle(domain); !res)
        return res.error();
    else
        return acceptor(res.value());
}